

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

void soul::buildFunctions(ModuleBase *module,Module *m,StringDictionary *dictionary)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Function *pFVar3;
  string *psVar4;
  VariableDeclaration *pVVar5;
  Function *f_00;
  VariableDeclaration *v;
  VariableDeclaration *v_00;
  Annotation local_450;
  string local_418;
  Expression local_3f8;
  string local_3e0;
  Comment local_3c0;
  undefined1 local_380 [8];
  Variable param;
  pool_ref<soul::AST::VariableDeclaration> *p;
  iterator __end4;
  iterator __begin4;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *__range4;
  Expression *local_288;
  Expression *ret;
  string local_260;
  undefined1 local_240 [8];
  CodeLocationRange nameWithGenerics;
  undefined1 local_210 [8];
  CodeLocation openParen;
  string local_1e0;
  Comment local_1b0;
  undefined1 local_170 [8];
  Function desc;
  pool_ref<soul::AST::Function> *f;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *__range2;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *functions;
  StringDictionary *dictionary_local;
  Module *m_local;
  ModuleBase *module_local;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *this;
  
  iVar2 = (*(module->super_ASTObject)._vptr_ASTObject[0xc])();
  this = (vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
          *)CONCAT44(extraout_var,iVar2);
  if (this != (vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
               *)0x0) {
    __end2 = std::
             vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
             ::begin(this);
    f = (pool_ref<soul::AST::Function> *)
        std::
        vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
        ::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
                                       *)&f), bVar1) {
      desc.annotation.properties._M_h._M_single_bucket =
           (__node_base_ptr)
           __gnu_cxx::
           __normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
           ::operator*(&__end2);
      pFVar3 = pool_ref::operator_cast_to_Function_
                         ((pool_ref *)desc.annotation.properties._M_h._M_single_bucket);
      bVar1 = shouldShow(pFVar3);
      if (bVar1) {
        SourceCodeModel::Function::Function((Function *)local_170);
        pFVar3 = pool_ref<soul::AST::Function>::operator->
                           ((pool_ref<soul::AST::Function> *)
                            desc.annotation.properties._M_h._M_single_bucket);
        getComment(&local_1b0,&(pFVar3->super_ASTObject).context);
        SourceCodeUtilities::Comment::operator=((Comment *)local_170,&local_1b0);
        SourceCodeUtilities::Comment::~Comment(&local_1b0);
        pFVar3 = pool_ref<soul::AST::Function>::operator->
                           ((pool_ref<soul::AST::Function> *)
                            desc.annotation.properties._M_h._M_single_bucket);
        psVar4 = Identifier::toString_abi_cxx11_(&pFVar3->name);
        std::__cxx11::string::operator=
                  ((string *)(desc.UID.field_2._M_local_buf + 8),(string *)psVar4);
        TokenisedPathString::join
                  (&local_1e0,&m->fullyQualifiedName,(string *)((long)&desc.UID.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(desc.nameWithGenerics.field_2._M_local_buf + 8),(string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        pFVar3 = pool_ref::operator_cast_to_Function_
                           ((pool_ref *)desc.annotation.properties._M_h._M_single_bucket);
        makeUID_abi_cxx11_((string *)&openParen.location,(soul *)pFVar3,f_00);
        std::__cxx11::string::operator=
                  ((string *)
                   &desc.returnType.sections.
                    super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&openParen.location
                  );
        std::__cxx11::string::~string((string *)&openParen.location);
        pFVar3 = pool_ref<soul::AST::Function>::operator->
                           ((pool_ref<soul::AST::Function> *)
                            desc.annotation.properties._M_h._M_single_bucket);
        CodeLocation::CodeLocation
                  ((CodeLocation *)&nameWithGenerics.end.location,&(pFVar3->nameLocation).location);
        SourceCodeUtilities::findNextOccurrence
                  ((SourceCodeUtilities *)local_210,(CodeLocation *)&nameWithGenerics.end.location,
                   '(');
        CodeLocation::~CodeLocation((CodeLocation *)&nameWithGenerics.end.location);
        bVar1 = CodeLocation::isEmpty((CodeLocation *)local_210);
        checkAssertion((bool)(~bVar1 & 1),"! openParen.isEmpty()","buildFunctions",0x182);
        pFVar3 = pool_ref<soul::AST::Function>::operator->
                           ((pool_ref<soul::AST::Function> *)
                            desc.annotation.properties._M_h._M_single_bucket);
        CodeLocation::CodeLocation((CodeLocation *)local_240,&(pFVar3->nameLocation).location);
        CodeLocation::CodeLocation
                  ((CodeLocation *)&nameWithGenerics.start.location,(CodeLocation *)local_210);
        CodeLocationRange::toString_abi_cxx11_((string *)&ret,(CodeLocationRange *)local_240);
        simplifyWhitespace(&local_260,(string *)&ret);
        std::__cxx11::string::operator=
                  ((string *)(desc.bareName.field_2._M_local_buf + 8),(string *)&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&ret);
        pFVar3 = pool_ref<soul::AST::Function>::operator->
                           ((pool_ref<soul::AST::Function> *)
                            desc.annotation.properties._M_h._M_single_bucket);
        local_288 = pool_ptr<soul::AST::Expression>::get(&pFVar3->returnType);
        if (local_288 != (Expression *)0x0) {
          ExpressionHelpers::create((Expression *)&__range4,local_288,dictionary);
          SourceCodeModel::Expression::operator=
                    ((Expression *)&desc.comment.range.end.location,(Expression *)&__range4);
          SourceCodeModel::Expression::~Expression((Expression *)&__range4);
        }
        pFVar3 = pool_ref<soul::AST::Function>::operator->
                           ((pool_ref<soul::AST::Function> *)
                            desc.annotation.properties._M_h._M_single_bucket);
        __end4 = std::
                 vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                 ::begin(&pFVar3->parameters);
        p = (pool_ref<soul::AST::VariableDeclaration> *)
            std::
            vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
            ::end(&pFVar3->parameters);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
                                           *)&p), bVar1) {
          param._184_8_ =
               __gnu_cxx::
               __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
               ::operator*(&__end4);
          SourceCodeModel::Variable::Variable((Variable *)local_380);
          pVVar5 = pool_ref<soul::AST::VariableDeclaration>::operator->
                             ((pool_ref<soul::AST::VariableDeclaration> *)param._184_8_);
          getComment(&local_3c0,&(pVVar5->super_Statement).super_ASTObject.context);
          SourceCodeUtilities::Comment::operator=((Comment *)local_380,&local_3c0);
          SourceCodeUtilities::Comment::~Comment(&local_3c0);
          pVVar5 = pool_ref<soul::AST::VariableDeclaration>::operator->
                             ((pool_ref<soul::AST::VariableDeclaration> *)param._184_8_);
          psVar4 = Identifier::toString_abi_cxx11_(&pVVar5->name);
          std::__cxx11::string::operator=
                    ((string *)(param.UID.field_2._M_local_buf + 8),(string *)psVar4);
          pVVar5 = pool_ref::operator_cast_to_VariableDeclaration_((pool_ref *)param._184_8_);
          makeUID_abi_cxx11_(&local_3e0,(soul *)pVVar5,v);
          std::__cxx11::string::operator=
                    ((string *)
                     &param.type.sections.
                      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_3e0);
          pVVar5 = pool_ref::operator_cast_to_VariableDeclaration_((pool_ref *)param._184_8_);
          ExpressionHelpers::forVariable(&local_3f8,pVVar5,dictionary);
          SourceCodeModel::Expression::operator=
                    ((Expression *)&param.comment.range.end.location,&local_3f8);
          SourceCodeModel::Expression::~Expression(&local_3f8);
          pVVar5 = pool_ref::operator_cast_to_VariableDeclaration_((pool_ref *)param._184_8_);
          getInitialiserValue_abi_cxx11_(&local_418,(soul *)pVVar5,v_00);
          std::__cxx11::string::operator=
                    ((string *)(param.name.field_2._M_local_buf + 8),(string *)&local_418);
          std::__cxx11::string::~string((string *)&local_418);
          std::
          vector<soul::SourceCodeModel::Variable,_std::allocator<soul::SourceCodeModel::Variable>_>
          ::push_back((vector<soul::SourceCodeModel::Variable,_std::allocator<soul::SourceCodeModel::Variable>_>
                       *)((long)&desc.fullyQualifiedName.field_2 + 8),(value_type *)local_380);
          SourceCodeModel::Variable::~Variable((Variable *)local_380);
          __gnu_cxx::
          __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
          ::operator++(&__end4);
        }
        pFVar3 = pool_ref<soul::AST::Function>::operator->
                           ((pool_ref<soul::AST::Function> *)
                            desc.annotation.properties._M_h._M_single_bucket);
        createAnnotation(&local_450,&pFVar3->annotation,dictionary);
        SourceCodeModel::Annotation::operator=
                  ((Annotation *)
                   &desc.parameters.
                    super__Vector_base<soul::SourceCodeModel::Variable,_std::allocator<soul::SourceCodeModel::Variable>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_450);
        SourceCodeModel::Annotation::~Annotation(&local_450);
        std::
        vector<soul::SourceCodeModel::Function,_std::allocator<soul::SourceCodeModel::Function>_>::
        push_back(&m->functions,(value_type *)local_170);
        CodeLocationRange::~CodeLocationRange((CodeLocationRange *)local_240);
        CodeLocation::~CodeLocation((CodeLocation *)local_210);
        SourceCodeModel::Function::~Function((Function *)local_170);
      }
      __gnu_cxx::
      __normal_iterator<soul::pool_ref<soul::AST::Function>_*,_std::vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

static void buildFunctions (AST::ModuleBase& module, SourceCodeModel::Module& m, const StringDictionary& dictionary)
{
    if (auto functions = module.getFunctionList())
    {
        for (auto& f : *functions)
        {
            if (shouldShow (f))
            {
                SourceCodeModel::Function desc;
                desc.comment = getComment (f->context);
                desc.bareName = f->name.toString();
                desc.fullyQualifiedName = TokenisedPathString::join (m.fullyQualifiedName, desc.bareName);
                desc.UID = makeUID (f);

                auto openParen = SourceCodeUtilities::findNextOccurrence (f->nameLocation.location, '(');
                SOUL_ASSERT (! openParen.isEmpty());

                CodeLocationRange nameWithGenerics { f->nameLocation.location, openParen };
                desc.nameWithGenerics = simplifyWhitespace (nameWithGenerics.toString());

                if (auto ret = f->returnType.get())
                    desc.returnType = ExpressionHelpers::create (*ret, dictionary);

                for (auto& p : f->parameters)
                {
                    SourceCodeModel::Variable param;
                    param.comment = getComment (p->context);
                    param.name = p->name.toString();
                    param.UID = makeUID (p);
                    param.type = ExpressionHelpers::forVariable (p, dictionary);
                    param.initialiser = getInitialiserValue (p);

                    desc.parameters.push_back (std::move (param));
                }

                desc.annotation = createAnnotation (f->annotation, dictionary);

                m.functions.push_back (std::move (desc));
            }
        }
    }
}